

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_conn_cb(void *arg)

{
  long lVar1;
  nni_aio *pnVar2;
  nng_err result;
  int iVar3;
  uint32_t uVar4;
  void *pvVar5;
  int local_54;
  void *pvStack_50;
  int i;
  ws_header *hdr;
  uint8_t raw [16];
  nng_err local_2c;
  int rv;
  nni_aio *uaio;
  nni_ws *ws;
  nni_ws_dialer *d;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 0xa10);
  result = nni_aio_result((nni_aio *)((long)arg + 0x818));
  if (result == NNG_OK) {
    pvVar5 = nni_aio_get_output((nni_aio *)((long)arg + 0x818),0);
    *(void **)((long)arg + 0x9e8) = pvVar5;
    nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
    pnVar2 = *(nni_aio **)((long)arg + 0x9e0);
    nni_aio_set_output((nni_aio *)((long)arg + 0x818),0,(void *)0x0);
    if (pnVar2 == (nni_aio *)0x0) {
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
      ws_reap((nni_ws *)arg);
    }
    else {
      for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
        uVar4 = nni_random();
        raw[(long)local_54 + -8] = (uint8_t)uVar4;
      }
      nni_base64_encode((uint8_t *)&hdr,0x10,(char *)((long)arg + 0xa18),0x18);
      *(undefined1 *)((long)arg + 0xa30) = 0;
      local_2c = nni_http_set_uri(*(nng_http **)((long)arg + 0x9e8),
                                  *(char **)(*(long *)(lVar1 + 0xc0) + 0x20),
                                  *(char **)(*(long *)(lVar1 + 0xc0) + 0x28));
      if (local_2c == NNG_OK) {
        nni_http_set_static_header
                  (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xa38),
                   "Connection","Upgrade");
        nni_http_set_static_header
                  (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xa60),
                   "Upgrade","websocket");
        nni_http_set_static_header
                  (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xab0),
                   "Sec-WebSocket-Key",(char *)((long)arg + 0xa18));
        nni_http_set_static_header
                  (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xb00),
                   "Sec-WebSocket-Version","13");
        if (*(long *)(lVar1 + 0xb8) != 0) {
          nni_http_set_static_header
                    (*(nng_http **)((long)arg + 0x9e8),(nni_http_header *)((long)arg + 0xad8),
                     "Sec-WebSocket-Protocol",*(char **)(lVar1 + 0xb8));
        }
        for (pvStack_50 = nni_list_first((nni_list *)(lVar1 + 0xe8)); pvStack_50 != (void *)0x0;
            pvStack_50 = nni_list_next((nni_list *)(lVar1 + 0xe8),pvStack_50)) {
          local_2c = nni_http_set_header(*(nng_http **)((long)arg + 0x9e8),
                                         *(char **)((long)pvStack_50 + 0x10),
                                         *(char **)((long)pvStack_50 + 0x18));
          if (local_2c != NNG_OK) goto LAB_0013c73d;
        }
        nni_http_write_req(*(nng_http **)((long)arg + 0x9e8),(nni_aio *)((long)arg + 0x650));
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
      }
      else {
LAB_0013c73d:
        nni_aio_finish_error(pnVar2,local_2c);
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
        ws_reap((nni_ws *)arg);
      }
    }
  }
  else {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
    pnVar2 = *(nni_aio **)((long)arg + 0x9e0);
    if (pnVar2 != (nni_aio *)0x0) {
      *(undefined8 *)((long)arg + 0x9e0) = 0;
      nni_aio_finish_error(pnVar2,result);
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
    nni_mtx_lock((nni_mtx *)(lVar1 + 0x58));
    iVar3 = nni_list_node_active((nni_list_node *)((long)arg + 0x38));
    if (iVar3 == 0) {
      nni_mtx_unlock((nni_mtx *)(lVar1 + 0x58));
    }
    else {
      nni_list_remove((nni_list *)(lVar1 + 200),arg);
      *(undefined8 *)((long)arg + 0xa10) = 0;
      iVar3 = nni_list_empty((nni_list *)(lVar1 + 200));
      if (iVar3 != 0) {
        nni_cv_wake((nni_cv *)(lVar1 + 0x80));
      }
      nni_mtx_unlock((nni_mtx *)(lVar1 + 0x58));
      ws_reap((nni_ws *)arg);
    }
  }
  return;
}

Assistant:

void
ws_conn_cb(void *arg)
{
	nni_ws_dialer *d;
	nni_ws        *ws;
	nni_aio       *uaio;
	int            rv;
	uint8_t        raw[16];
	ws_header     *hdr;

	ws = arg;

	d = ws->dialer;
	if ((rv = nni_aio_result(&ws->connaio)) != 0) {
		nni_mtx_lock(&ws->mtx);
		if ((uaio = ws->useraio) != NULL) {
			ws->useraio = NULL;
			nni_aio_finish_error(uaio, rv);
		}
		nni_mtx_unlock(&ws->mtx);
		nni_mtx_lock(&d->mtx);
		if (nni_list_node_active(&ws->node)) {
			nni_list_remove(&d->wspend, ws);
			ws->dialer = NULL;
			if (nni_list_empty(&d->wspend)) {
				nni_cv_wake(&d->cv);
			}
			nni_mtx_unlock(&d->mtx);
			ws_reap(ws);
		} else {
			nni_mtx_unlock(&d->mtx);
		}
		return;
	}

	ws->http = nni_aio_get_output(&ws->connaio, 0);
	nni_mtx_lock(&ws->mtx);
	uaio = ws->useraio;
	nni_aio_set_output(&ws->connaio, 0, NULL);
	if (uaio == NULL) {
		// This request was canceled for some reason.
		nni_mtx_unlock(&ws->mtx);
		ws_reap(ws);
		return;
	}

	for (int i = 0; i < 16; i++) {
		raw[i] = (uint8_t) nni_random();
	}
	nni_base64_encode(raw, 16, ws->keybuf, 24);
	ws->keybuf[24] = '\0';

	if ((rv = nni_http_set_uri(
	         ws->http, d->url->u_path, d->url->u_query)) != 0) {
		goto err;
	}

	nni_http_set_static_header(
	    ws->http, &ws->hdrs.connection, "Connection", "Upgrade");
	nni_http_set_static_header(
	    ws->http, &ws->hdrs.upgrade, "Upgrade", "websocket");
	nni_http_set_static_header(
	    ws->http, &ws->hdrs.wskey, "Sec-WebSocket-Key", ws->keybuf);
	nni_http_set_static_header(
	    ws->http, &ws->hdrs.wsversion, "Sec-WebSocket-Version", "13");

	if (d->proto != NULL) {
		nni_http_set_static_header(ws->http, &ws->hdrs.wsproto,
		    "Sec-WebSocket-Protocol", d->proto);
	}

	NNI_LIST_FOREACH (&d->headers, hdr) {
		if ((rv = nni_http_set_header(
		         ws->http, hdr->name, hdr->value)) != 0) {
			goto err;
		}
	}

	nni_http_write_req(ws->http, &ws->httpaio);
	nni_mtx_unlock(&ws->mtx);
	return;

err:
	nni_aio_finish_error(uaio, rv);
	nni_mtx_unlock(&ws->mtx);
	ws_reap(ws);
}